

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> * __thiscall
data_structures::LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
insertAfterNode(LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,
               ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_current,
               SPElement *new_element)

{
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar1;
  SPElement *new_element_local;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_current_local;
  LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_local;
  
  pLVar1 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
           operator_new(0x18);
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::ListNode
            (pLVar1,new_element,
             (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0);
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::insertAfter
            (_current,pLVar1);
  this->_size = this->_size + 1;
  if (_current == this->_tail) {
    pLVar1 = ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::next(_current);
    this->_tail = pLVar1;
  }
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::insertAfterNode(ListNode<T>* _current, const T &new_element){
        _current->insertAfter(new ListNode<T>(new_element));
        _size++;
        if (_current == _tail) {
            _tail = _current->next();
        }
        return this;
    }